

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Point2f __thiscall pbrt::detail::Stratified2DIter::operator*(Stratified2DIter *this)

{
  int iVar1;
  int iVar2;
  int *in_RDI;
  float fVar3;
  float fVar4;
  int iy;
  int ix;
  int *piVar5;
  undefined4 in_stack_ffffffffffffffd4;
  Tuple2<pbrt::Point2,_float> local_8;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[6];
  fVar3 = (float)(*in_RDI % in_RDI[6]);
  piVar5 = in_RDI + 2;
  RNG::Uniform<float>((RNG *)CONCAT44(in_stack_ffffffffffffffd4,fVar3));
  fVar4 = (float)(iVar1 / iVar2);
  RNG::Uniform<float>((RNG *)CONCAT44(fVar4,fVar3));
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(fVar4,fVar3),(float)((ulong)piVar5 >> 0x20),SUB84(piVar5,0));
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f operator*() {
        int ix = i % nx, iy = i / nx;
        return {(ix + rng.Uniform<Float>()) / nx, (iy + rng.Uniform<Float>()) / ny};
    }